

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_server_main(http_server_t *server,void *data)

{
  http_client_t *client;
  uint uVar1;
  http_client_t *phVar2;
  int iVar3;
  uint __i;
  int iVar4;
  long lVar5;
  ssize_t sVar6;
  long lVar7;
  char *msg;
  int iVar8;
  char *comment;
  ulong uVar9;
  unsigned_long code;
  timeval local_c8;
  fd_set fds;
  
  http_server_assert(server);
  local_c8.tv_sec = 0;
  local_c8.tv_usec = 0;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    fds.__fds_bits[lVar5] = 0;
  }
  fds.__fds_bits[server->fd / 0x40] =
       fds.__fds_bits[server->fd / 0x40] | 1L << ((byte)server->fd & 0x3f);
  uVar1 = server->num_clients;
  for (lVar5 = 0; (ulong)uVar1 * 0x2018 - lVar5 != 0; lVar5 = lVar5 + 0x2018) {
    iVar4 = *(int *)(server->clients->buf + lVar5 + -0x10);
    if (iVar4 != -1) {
      fds.__fds_bits[iVar4 / 0x40] = fds.__fds_bits[iVar4 / 0x40] | 1L << ((byte)iVar4 & 0x3f);
    }
  }
  iVar8 = 0;
  iVar4 = select(0x400,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
  if (-1 < iVar4) {
    if ((((ulong)fds.__fds_bits[server->fd / 0x40] >> ((long)server->fd % 0x40 & 0x3fU) & 1) != 0)
       && (iVar4 = http_server_accept(server), iVar4 == 0)) {
      return 0;
    }
    lVar5 = 0;
    for (uVar9 = 0; uVar9 < server->num_clients; uVar9 = uVar9 + 1) {
      phVar2 = server->clients;
      iVar4 = phVar2[uVar9].fd;
      if ((iVar4 != -1) &&
         (((ulong)fds.__fds_bits[iVar4 / 0x40] >> ((long)iVar4 % 0x40 & 0x3fU) & 1) != 0)) {
        client = phVar2 + uVar9;
        http_server_assert(server);
        sVar6 = read(client->fd,client->buf + client->len,(long)(0x1ffb - client->len));
        if (0 < (int)sVar6) {
          client->in = client->in + (int)sVar6;
          if (1 < client->found) goto LAB_00105634;
          time((time_t *)0x0);
          iVar4 = client->found;
          iVar8 = client->len;
          for (lVar7 = (long)iVar8; (iVar8 = iVar8 + 1, iVar4 < 2 && (lVar7 < client->in));
              lVar7 = lVar7 + 1) {
            if (phVar2->buf[lVar7 + lVar5] != '\r') {
              iVar3 = 0;
              if (phVar2->buf[lVar7 + lVar5] == '\n') {
                iVar3 = iVar4 + 1;
              }
              iVar4 = iVar3;
              client->found = iVar4;
            }
            client->len = iVar8;
          }
          if (lVar7 < 10) {
            code = 400;
            comment = "Bad Request";
            msg = "Not HTTP";
          }
          else {
            phVar2->buf[lVar7 + lVar5] = '\0';
            iVar4 = strncasecmp(client->buf,"GET /",5);
            if (iVar4 == 0) {
              sVar6 = write(client->fd,"HTTP/1.0 200 OK\r\n\r\n",0x13);
              if (sVar6 != 0x13) goto LAB_00105623;
              if ((server->callback == (http_client_callback_t *)0x0) ||
                 (iVar4 = (*server->callback)(client,data), -1 < iVar4)) goto LAB_00105634;
              code = 500;
              comment = "Server Internal Error";
              msg = "Callback returned error";
            }
            else {
              code = 400;
              comment = "Bad Request";
              msg = "Unsupported HTTP Method";
            }
          }
          http_bad_request(client,code,comment,msg);
        }
LAB_00105623:
        http_client_close(server,server->clients + uVar9);
      }
LAB_00105634:
      lVar5 = lVar5 + 0x2018;
    }
    http_server_check(server);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int http_server_main(http_server_t *server, void *data) {
  http_server_assert(server);

  int i;
  
  fd_set fds;
  struct timeval tout;
  
  tout.tv_usec = 0;
  tout.tv_sec = 0;
  
  FD_ZERO(&fds);
  
  /* Select the listening HTTP socket. */
  FD_SET(server->fd, &fds);
  
  /* Select all active client sockets. */
  for (i = 0; i < server->num_clients; i++) {
    if (server->clients[i].fd != -1) {
      FD_SET(server->clients[i].fd, &fds);
    }
  }
  
  if (select(FD_SETSIZE, &fds, NULL, NULL, &tout) < 0) {
    return 0;
  }
  
  /* Accept incoming connections. */
  if (FD_ISSET(server->fd, &fds)) {
    if (!http_server_accept(server))
      return 0;
  }
  
  /* Read incoming client data. */
  for (i = 0; i < server->num_clients; i++) {
    if ((server->clients[i].fd != -1) &&
        (FD_ISSET(server->clients[i].fd, &fds))) {
      if (http_handle_client(server, server->clients + i, data) < 0) {
        http_client_close(server, server->clients + i);
      }
    }
  }
  
  /* Check for client timeouts. */
  http_server_check(server);
  
  return 1;
}